

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask exprSelectTableUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  short *psVar1;
  Bitmask BVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  int local_2c;
  int i;
  SrcList *pSrc;
  Bitmask mask;
  Select *pS_local;
  WhereMaskSet *pMaskSet_local;
  
  pSrc = (SrcList *)0x0;
  for (mask = (Bitmask)pS; mask != 0; mask = *(Bitmask *)(mask + 0x50)) {
    psVar1 = *(short **)(mask + 0x28);
    BVar2 = exprListTableUsage(pMaskSet,*(ExprList **)mask);
    BVar3 = exprListTableUsage(pMaskSet,*(ExprList **)(mask + 0x38));
    BVar4 = exprListTableUsage(pMaskSet,*(ExprList **)(mask + 0x48));
    BVar5 = exprTableUsage(pMaskSet,*(Expr **)(mask + 0x30));
    BVar6 = exprTableUsage(pMaskSet,*(Expr **)(mask + 0x40));
    pSrc = (SrcList *)(BVar6 | BVar5 | BVar4 | BVar3 | BVar2 | (ulong)pSrc);
    if (psVar1 != (short *)0x0) {
      for (local_2c = 0; local_2c < *psVar1; local_2c = local_2c + 1) {
        BVar2 = exprSelectTableUsage(pMaskSet,*(Select **)(psVar1 + (long)local_2c * 0x34 + 0x18));
        BVar3 = exprTableUsage(pMaskSet,*(Expr **)(psVar1 + (long)local_2c * 0x34 + 0x24));
        pSrc = (SrcList *)(BVar3 | BVar2 | (ulong)pSrc);
      }
    }
  }
  return (Bitmask)pSrc;
}

Assistant:

static Bitmask exprSelectTableUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= exprListTableUsage(pMaskSet, pS->pEList);
    mask |= exprListTableUsage(pMaskSet, pS->pGroupBy);
    mask |= exprListTableUsage(pMaskSet, pS->pOrderBy);
    mask |= exprTableUsage(pMaskSet, pS->pWhere);
    mask |= exprTableUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectTableUsage(pMaskSet, pSrc->a[i].pSelect);
        mask |= exprTableUsage(pMaskSet, pSrc->a[i].pOn);
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}